

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::MergeBones(aiMesh *out,const_iterator it,const_iterator end)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  _List_node_base **pp_Var12;
  aiMesh *paVar13;
  aiBone **ppaVar14;
  aiBone *paVar15;
  Logger *this;
  aiVertexWeight *__s;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  const_iterator boneEnd;
  aiVertexWeight *paVar18;
  ulong uVar19;
  _List_node_base *p_Var20;
  list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> asBones;
  _List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> local_468;
  float *local_450;
  aiMesh *local_448;
  float *local_440;
  undefined1 local_430 [1024];
  
  local_468._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_468;
  local_468._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_468;
  if ((out != (aiMesh *)0x0) && (out->mNumBones != 0)) {
    local_468._M_impl._M_node._M_size = 0;
    BuildUniqueBoneList((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)
                        &local_468,it,end);
    out->mNumBones = 0;
    ppaVar14 = (aiBone **)
               operator_new__(-(ulong)(local_468._M_impl._M_node._M_size >> 0x3d != 0) |
                              local_468._M_impl._M_node._M_size << 3);
    out->mBones = ppaVar14;
    p_Var20 = local_468._M_impl._M_node.super__List_node_base._M_next;
    paVar13 = out;
    if (local_468._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_468) {
      do {
        local_448 = paVar13;
        paVar13 = local_448;
        paVar15 = (aiBone *)operator_new(0x460);
        (paVar15->mName).length = 0;
        (paVar15->mName).data[0] = '\0';
        memset((paVar15->mName).data + 1,0x1b,0x3ff);
        paVar15->mNumWeights = 0;
        paVar15->mWeights = (aiVertexWeight *)0x0;
        (paVar15->mOffsetMatrix).a1 = 1.0;
        (paVar15->mOffsetMatrix).a2 = 0.0;
        (paVar15->mOffsetMatrix).a3 = 0.0;
        (paVar15->mOffsetMatrix).a4 = 0.0;
        (paVar15->mOffsetMatrix).b1 = 0.0;
        (paVar15->mOffsetMatrix).b2 = 1.0;
        (paVar15->mOffsetMatrix).b3 = 0.0;
        (paVar15->mOffsetMatrix).b4 = 0.0;
        (paVar15->mOffsetMatrix).c1 = 0.0;
        (paVar15->mOffsetMatrix).c2 = 0.0;
        (paVar15->mOffsetMatrix).c3 = 1.0;
        (paVar15->mOffsetMatrix).c4 = 0.0;
        (paVar15->mOffsetMatrix).d1 = 0.0;
        (paVar15->mOffsetMatrix).d2 = 0.0;
        (paVar15->mOffsetMatrix).d3 = 0.0;
        (paVar15->mOffsetMatrix).d4 = 1.0;
        uVar3 = paVar13->mNumBones;
        paVar13->mNumBones = uVar3 + 1;
        paVar13->mBones[uVar3] = paVar15;
        uVar3 = *(uint *)&(p_Var20[1]._M_prev)->_M_next;
        if (0x3fe < uVar3) {
          uVar3 = 0x3ff;
        }
        uVar19 = (ulong)uVar3;
        memcpy(local_430,(void *)((long)&(p_Var20[1]._M_prev)->_M_next + 4),uVar19);
        local_430[uVar19] = 0;
        (paVar15->mName).length = uVar3;
        memcpy((paVar15->mName).data,local_430,uVar19);
        (paVar15->mName).data[uVar19] = '\0';
        p_Var16 = p_Var20[2]._M_next;
        p_Var4 = p_Var20[2]._M_prev;
        if (p_Var16 != p_Var4) {
          local_440 = &(paVar15->mOffsetMatrix).b3;
          local_450 = &(paVar15->mOffsetMatrix).c4;
          do {
            paVar15->mNumWeights =
                 paVar15->mNumWeights + *(int *)((long)&p_Var16->_M_next[0x40]._M_next + 4);
            p_Var17 = p_Var16->_M_next;
            if (p_Var16 == p_Var20[2]._M_next) {
LAB_003c1669:
              p_Var5 = p_Var17[0x42]._M_next;
              p_Var6 = p_Var17[0x42]._M_prev;
              p_Var7 = p_Var17[0x43]._M_next;
              p_Var8 = p_Var17[0x43]._M_prev;
              p_Var9 = p_Var17[0x44]._M_next;
              p_Var10 = p_Var17[0x44]._M_prev;
              p_Var11 = p_Var17[0x45]._M_prev;
              *(_List_node_base **)&(paVar15->mOffsetMatrix).d1 = p_Var17[0x45]._M_next;
              *(_List_node_base **)&(paVar15->mOffsetMatrix).d3 = p_Var11;
              *(_List_node_base **)&(paVar15->mOffsetMatrix).c1 = p_Var9;
              *(_List_node_base **)&(paVar15->mOffsetMatrix).c3 = p_Var10;
              *(_List_node_base **)&(paVar15->mOffsetMatrix).b1 = p_Var7;
              *(_List_node_base **)&(paVar15->mOffsetMatrix).b3 = p_Var8;
              *(_List_node_base **)&paVar15->mOffsetMatrix = p_Var5;
              *(_List_node_base **)&(paVar15->mOffsetMatrix).a3 = p_Var6;
            }
            else {
              fVar2 = (paVar15->mOffsetMatrix).a1;
              if ((fVar2 == *(float *)&p_Var17[0x42]._M_next) &&
                 (!NAN(fVar2) && !NAN(*(float *)&p_Var17[0x42]._M_next))) {
                fVar2 = (paVar15->mOffsetMatrix).a2;
                pfVar1 = (float *)((long)&p_Var17[0x42]._M_next + 4);
                if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                  fVar2 = (paVar15->mOffsetMatrix).a3;
                  if ((fVar2 == *(float *)&p_Var17[0x42]._M_prev) &&
                     (!NAN(fVar2) && !NAN(*(float *)&p_Var17[0x42]._M_prev))) {
                    fVar2 = (paVar15->mOffsetMatrix).a4;
                    pfVar1 = (float *)((long)&p_Var17[0x42]._M_prev + 4);
                    if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                      fVar2 = (paVar15->mOffsetMatrix).b1;
                      if ((fVar2 == *(float *)&p_Var17[0x43]._M_next) &&
                         (!NAN(fVar2) && !NAN(*(float *)&p_Var17[0x43]._M_next))) {
                        fVar2 = (paVar15->mOffsetMatrix).b2;
                        pfVar1 = (float *)((long)&p_Var17[0x43]._M_next + 4);
                        if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                          if ((*local_440 == *(float *)&p_Var17[0x43]._M_prev) &&
                             (!NAN(*local_440) && !NAN(*(float *)&p_Var17[0x43]._M_prev))) {
                            fVar2 = (paVar15->mOffsetMatrix).b4;
                            pfVar1 = (float *)((long)&p_Var17[0x43]._M_prev + 4);
                            if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                              fVar2 = (paVar15->mOffsetMatrix).c1;
                              if ((fVar2 == *(float *)&p_Var17[0x44]._M_next) &&
                                 (!NAN(fVar2) && !NAN(*(float *)&p_Var17[0x44]._M_next))) {
                                fVar2 = (paVar15->mOffsetMatrix).c2;
                                pfVar1 = (float *)((long)&p_Var17[0x44]._M_next + 4);
                                if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                                  fVar2 = (paVar15->mOffsetMatrix).c3;
                                  if ((fVar2 == *(float *)&p_Var17[0x44]._M_prev) &&
                                     (!NAN(fVar2) && !NAN(*(float *)&p_Var17[0x44]._M_prev))) {
                                    pfVar1 = (float *)((long)&p_Var17[0x44]._M_prev + 4);
                                    if ((*local_450 == *pfVar1) &&
                                       (!NAN(*local_450) && !NAN(*pfVar1))) {
                                      fVar2 = (paVar15->mOffsetMatrix).d1;
                                      if ((fVar2 == *(float *)&p_Var17[0x45]._M_next) &&
                                         (!NAN(fVar2) && !NAN(*(float *)&p_Var17[0x45]._M_next))) {
                                        fVar2 = (paVar15->mOffsetMatrix).d2;
                                        pfVar1 = (float *)((long)&p_Var17[0x45]._M_next + 4);
                                        if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                                          fVar2 = (paVar15->mOffsetMatrix).d3;
                                          if ((fVar2 == *(float *)&p_Var17[0x45]._M_prev) &&
                                             (!NAN(fVar2) && !NAN(*(float *)&p_Var17[0x45]._M_prev))
                                             ) {
                                            fVar2 = (paVar15->mOffsetMatrix).d4;
                                            pfVar1 = (float *)((long)&p_Var17[0x45]._M_prev + 4);
                                            if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))
                                               ) goto LAB_003c1669;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              this = DefaultLogger::get();
              Logger::warn(this,
                           "Bones with equal names but different offset matrices can\'t be joined at the moment"
                          );
            }
            p_Var16 = p_Var16 + 1;
          } while (p_Var16 != p_Var4);
        }
        uVar3 = paVar15->mNumWeights;
        uVar19 = (ulong)uVar3 * 8;
        __s = (aiVertexWeight *)operator_new__(uVar19);
        if (uVar3 != 0) {
          memset(__s,0,uVar19);
        }
        paVar15->mWeights = __s;
        p_Var16 = p_Var20[2]._M_next;
        p_Var17 = p_Var20[2]._M_prev;
        if (p_Var16 != p_Var4 && p_Var16 != p_Var17) {
          do {
            p_Var5 = p_Var16->_M_next;
            paVar18 = __s;
            if (*(int *)((long)&p_Var5[0x40]._M_next + 4) != 0) {
              uVar19 = 0;
              do {
                p_Var17 = p_Var5[0x41]._M_prev;
                __s[uVar19].mWeight = *(float *)((long)&p_Var17->_M_next + uVar19 * 8 + 4);
                __s[uVar19].mVertexId =
                     *(int *)&p_Var16->_M_prev + *(int *)(&p_Var17->_M_next + uVar19);
                uVar19 = uVar19 + 1;
                paVar18 = paVar18 + 1;
              } while (uVar19 < *(uint *)((long)&p_Var5[0x40]._M_next + 4));
              p_Var17 = p_Var20[2]._M_prev;
            }
            p_Var16 = p_Var16 + 1;
          } while ((p_Var16 != p_Var4) && (__s = paVar18, p_Var16 != p_Var17));
        }
        pp_Var12 = &p_Var20->_M_next;
        p_Var20 = *pp_Var12;
        paVar13 = local_448;
      } while (*pp_Var12 != (_List_node_base *)&local_468);
    }
    std::__cxx11::_List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::_M_clear
              (&local_468);
  }
  return;
}

Assistant:

void SceneCombiner::MergeBones(aiMesh* out,std::vector<aiMesh*>::const_iterator it,
    std::vector<aiMesh*>::const_iterator end)
{
    if ( nullptr == out || out->mNumBones == 0 ) {
        return;
    }

    // find we need to build an unique list of all bones.
    // we work with hashes to make the comparisons MUCH faster,
    // at least if we have many bones.
    std::list<BoneWithHash> asBones;
    BuildUniqueBoneList( asBones, it, end );

    // now create the output bones
    out->mNumBones = 0;
    out->mBones = new aiBone*[asBones.size()];

    for (std::list<BoneWithHash>::const_iterator boneIt = asBones.begin(),boneEnd = asBones.end(); boneIt != boneEnd; ++boneIt )  {
        // Allocate a bone and setup it's name
        aiBone* pc = out->mBones[out->mNumBones++] = new aiBone();
        pc->mName = aiString( *( boneIt->second ));

        std::vector< BoneSrcIndex >::const_iterator wend = boneIt->pSrcBones.end();

        // Loop through all bones to be joined for this bone
        for (std::vector< BoneSrcIndex >::const_iterator wmit = boneIt->pSrcBones.begin(); wmit != wend; ++wmit)  {
            pc->mNumWeights += (*wmit).first->mNumWeights;

            // NOTE: different offset matrices for bones with equal names
            // are - at the moment - not handled correctly.
            if (wmit != boneIt->pSrcBones.begin() && pc->mOffsetMatrix != wmit->first->mOffsetMatrix) {
                ASSIMP_LOG_WARN("Bones with equal names but different offset matrices can't be joined at the moment");
                continue;
            }
            pc->mOffsetMatrix = wmit->first->mOffsetMatrix;
        }

        // Allocate the vertex weight array
        aiVertexWeight* avw = pc->mWeights = new aiVertexWeight[pc->mNumWeights];

        // And copy the final weights - adjust the vertex IDs by the
        // face index offset of the corresponding mesh.
        for (std::vector< BoneSrcIndex >::const_iterator wmit = (*boneIt).pSrcBones.begin(); wmit != (*boneIt).pSrcBones.end(); ++wmit) {
            if (wmit == wend) {
                break;
            }

            aiBone* pip = (*wmit).first;
            for (unsigned int mp = 0; mp < pip->mNumWeights;++mp,++avw) {
                const aiVertexWeight& vfi = pip->mWeights[mp];
                avw->mWeight = vfi.mWeight;
                avw->mVertexId = vfi.mVertexId + (*wmit).second;
            }
        }
    }
}